

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

int __thiscall deqp::gles31::Functional::UniformCase::init(UniformCase *this,EVP_PKEY_CTX *ctx)

{
  UniformCollection *pUVar1;
  pointer pUVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar8;
  NotSupportedError *pNVar9;
  ulong uVar10;
  ulong uVar11;
  Functional *this_00;
  bool bVar12;
  int combinedTexUnitsSupported;
  int fragmentTexUnitsSupported;
  int vertexTexUnitsSupported;
  int combinedTexUnitsRequired;
  int fragmentTexUnitsRequired;
  int vertexTexUnitsRequired;
  int val;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  UniformCase *local_38;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  pUVar1 = (this->m_uniformCollection).m_ptr;
  pUVar2 = (pUVar1->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(pUVar1->m_uniforms).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x38;
  uVar11 = 0;
  uVar10 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar10 = uVar11;
  }
  this_00 = (Functional *)&pUVar2->type;
  while( true ) {
    bVar12 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    iVar5 = (int)uVar11;
    if (bVar12) break;
    iVar6 = getNumSamplersInType(this_00,(VarType *)ctx);
    uVar11 = (ulong)(uint)(iVar5 + iVar6);
    this_00 = this_00 + 0x38;
  }
  iVar6 = 0;
  if (this->m_caseShaderType != CASESHADERTYPE_FRAGMENT) {
    iVar6 = iVar5;
  }
  if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
    iVar5 = 0;
  }
  val = -1;
  combinedTexUnitsRequired = iVar6 + iVar5;
  fragmentTexUnitsRequired = iVar5;
  vertexTexUnitsRequired = iVar6;
  local_38 = this;
  (**(code **)(lVar7 + 0x868))(0x8b4c,&val);
  iVar3 = val;
  vertexTexUnitsSupported = val;
  val = -1;
  (**(code **)(lVar7 + 0x868))(0x8872,&val);
  iVar4 = val;
  fragmentTexUnitsSupported = val;
  val = -1;
  (**(code **)(lVar7 + 0x868))(0x8b4d,&val);
  combinedTexUnitsSupported = val;
  if (iVar3 < iVar6) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_98,&vertexTexUnitsRequired);
    std::operator+(&local_78,&local_98," vertex texture units required, ");
    de::toString<int>(&local_b8,&vertexTexUnitsSupported);
    std::operator+(&local_58,&local_78,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   &local_58," supported");
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)&val);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (iVar4 < iVar5) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_98,&fragmentTexUnitsRequired);
    std::operator+(&local_78,&local_98," fragment texture units required, ");
    de::toString<int>(&local_b8,&fragmentTexUnitsSupported);
    std::operator+(&local_58,&local_78,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   &local_58," supported");
    tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)&val);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (iVar6 + iVar5 <= val) {
    (local_38->super_CallLogWrapper).m_enableLog = true;
    return (int)local_38;
  }
  pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_98,&combinedTexUnitsRequired);
  std::operator+(&local_78,&local_98," combined texture units required, ");
  de::toString<int>(&local_b8,&combinedTexUnitsSupported);
  std::operator+(&local_58,&local_78,&local_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,&local_58
                 ," supported");
  tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)&val);
  __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UniformCase::init (void)
{
	{
		const glw::Functions&	funcs						= m_context.getRenderContext().getFunctions();
		const int				numSamplerUniforms			= m_uniformCollection->getNumSamplers();
		const int				vertexTexUnitsRequired		= m_caseShaderType != CASESHADERTYPE_FRAGMENT ? numSamplerUniforms : 0;
		const int				fragmentTexUnitsRequired	= m_caseShaderType != CASESHADERTYPE_VERTEX ? numSamplerUniforms : 0;
		const int				combinedTexUnitsRequired	= vertexTexUnitsRequired + fragmentTexUnitsRequired;
		const int				vertexTexUnitsSupported		= getGLInt(funcs, GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS);
		const int				fragmentTexUnitsSupported	= getGLInt(funcs, GL_MAX_TEXTURE_IMAGE_UNITS);
		const int				combinedTexUnitsSupported	= getGLInt(funcs, GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS);

		DE_ASSERT(numSamplerUniforms <= MAX_NUM_SAMPLER_UNIFORMS);

		if (vertexTexUnitsRequired > vertexTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(vertexTexUnitsRequired) + " vertex texture units required, " + de::toString(vertexTexUnitsSupported) + " supported");
		if (fragmentTexUnitsRequired > fragmentTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(fragmentTexUnitsRequired) + " fragment texture units required, " + de::toString(fragmentTexUnitsSupported) + " supported");
		if (combinedTexUnitsRequired > combinedTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(combinedTexUnitsRequired) + " combined texture units required, " + de::toString(combinedTexUnitsSupported) + " supported");
	}

	enableLogging(true);
}